

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Mem * columnMem(sqlite3_stmt *pStmt,int i)

{
  int in_ESI;
  sqlite3 *in_RDI;
  Mem *pOut;
  Vdbe *pVm;
  int err_code;
  Mem *local_8;
  
  err_code = -0x55555556;
  if (in_RDI == (sqlite3 *)0x0) {
    local_8 = columnNullValue();
  }
  else {
    sqlite3_mutex_enter((sqlite3_mutex *)0x1405f9);
    if (((*(long *)(in_RDI->aLimit + 6) == 0) ||
        ((int)(uint)(ushort)(in_RDI->init).newTnum <= in_ESI)) || (in_ESI < 0)) {
      sqlite3Error(in_RDI,err_code);
      local_8 = columnNullValue();
    }
    else {
      local_8 = (Mem *)(*(long *)(in_RDI->aLimit + 6) + (long)in_ESI * 0x38);
    }
  }
  return local_8;
}

Assistant:

static Mem *columnMem(sqlite3_stmt *pStmt, int i){
  Vdbe *pVm;
  Mem *pOut;

  pVm = (Vdbe *)pStmt;
  if( pVm==0 ) return (Mem*)columnNullValue();
  assert( pVm->db );
  sqlite3_mutex_enter(pVm->db->mutex);
  if( pVm->pResultRow!=0 && i<pVm->nResColumn && i>=0 ){
    pOut = &pVm->pResultRow[i];
  }else{
    sqlite3Error(pVm->db, SQLITE_RANGE);
    pOut = (Mem*)columnNullValue();
  }
  return pOut;
}